

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O3

Expression * __thiscall wasm::AlignmentLowering::lowerStoreI32(AlignmentLowering *this,Store *curr)

{
  ulong uVar1;
  address64_t aVar2;
  undefined1 auVar3 [16];
  Block *pBVar4;
  Index index;
  Index index_00;
  Memory *pMVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  Store *pSVar8;
  Const *pCVar9;
  Binary *pBVar10;
  ulong extraout_RDX;
  Type in_R8;
  optional<wasm::Type> type;
  optional<wasm::Type> type_;
  LocalSet *local_98;
  LocalSet *local_90;
  Block *local_88;
  Const *local_80;
  initializer_list<wasm::Expression_*> local_78;
  ulong local_68;
  Name *local_60;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_58;
  Index local_4c;
  Builder local_48;
  Builder builder;
  
  uVar1 = (curr->align).addr;
  if (uVar1 == 0) {
    return (Expression *)curr;
  }
  if (uVar1 == curr->bytes) {
    return (Expression *)curr;
  }
  local_48.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
       ).super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
       currModule;
  if ((curr->value->type).id != 2) {
    __assert_fail("curr->value->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                  ,0x92,"Expression *wasm::AlignmentLowering::lowerStoreI32(Store *)");
  }
  local_60 = &curr->memory;
  pMVar5 = Module::getMemory(local_48.wasm,(Name)(curr->memory).super_IString.str);
  local_68 = (pMVar5->addressType).id;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_68;
  index = Builder::addVar((Builder *)
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .
                          super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                          .currFunction,(Function *)0x0,(Name)(auVar3 << 0x40),in_R8);
  index_00 = Builder::addVar((Builder *)
                             (this->
                             super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                             ).
                             super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                             .
                             super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                             .currFunction,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
  local_98 = Builder::makeLocalSet(&local_48,index,curr->ptr);
  local_90 = Builder::makeLocalSet(&local_48,index_00,curr->value);
  local_78._M_len = 2;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  local_78._M_array = (iterator)&local_98;
  local_88 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (&local_48,&local_78,type);
  local_4c = index;
  if (curr->bytes == '\x04') {
    aVar2 = (curr->align).addr;
    if (aVar2 != 2) {
      if (aVar2 != 1) {
        handle_unreachable("invalid alignment",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                           ,0xe9);
      }
      local_58 = &(local_88->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
      builder.wasm = (Module *)(curr->offset).addr;
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(Index *)(pEVar6 + 1) = index;
      (pEVar6->type).id = local_68;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = index_00;
      (pEVar7->type).id = 2;
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&pSVar8->bytes = 0;
      (pSVar8->offset).addr = 0;
      (pSVar8->align).addr = 0;
      *(undefined8 *)&pSVar8->isAtomic = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      pSVar8->bytes = '\x01';
      (pSVar8->offset).addr = (address64_t)builder.wasm;
      (pSVar8->align).addr = 1;
      pSVar8->ptr = pEVar6;
      pSVar8->value = pEVar7;
      (pSVar8->valueType).id = 2;
      (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
      (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
      Store::finalize(pSVar8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_58,(Expression *)pSVar8);
      builder.wasm = (Module *)((curr->offset).addr + 1);
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(Index *)(pEVar6 + 1) = local_4c;
      (pEVar6->type).id = local_68;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = index_00;
      (pEVar7->type).id = 2;
      local_80 = Builder::makeConst<int>(&local_48,8);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = ShrUInt32;
      pBVar10->left = pEVar7;
      pBVar10->right = (Expression *)local_80;
      Binary::finalize(pBVar10);
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&pSVar8->bytes = 0;
      (pSVar8->offset).addr = 0;
      (pSVar8->align).addr = 0;
      *(undefined8 *)&pSVar8->isAtomic = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      pSVar8->bytes = '\x01';
      (pSVar8->offset).addr = (address64_t)builder.wasm;
      (pSVar8->align).addr = 1;
      pSVar8->ptr = pEVar6;
      pSVar8->value = (Expression *)pBVar10;
      (pSVar8->valueType).id = 2;
      (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
      (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
      Store::finalize(pSVar8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_58,(Expression *)pSVar8);
      builder.wasm = (Module *)((curr->offset).addr + 2);
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(Index *)(pEVar6 + 1) = local_4c;
      (pEVar6->type).id = local_68;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = index_00;
      (pEVar7->type).id = 2;
      local_80 = Builder::makeConst<int>(&local_48,0x10);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = ShrUInt32;
      pBVar10->left = pEVar7;
      pBVar10->right = (Expression *)local_80;
      Binary::finalize(pBVar10);
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&pSVar8->bytes = 0;
      (pSVar8->offset).addr = 0;
      (pSVar8->align).addr = 0;
      *(undefined8 *)&pSVar8->isAtomic = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      pSVar8->bytes = '\x01';
      (pSVar8->offset).addr = (address64_t)builder.wasm;
      (pSVar8->align).addr = 1;
      pSVar8->ptr = pEVar6;
      pSVar8->value = (Expression *)pBVar10;
      (pSVar8->valueType).id = 2;
      (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
      (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
      Store::finalize(pSVar8);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (local_58,(Expression *)pSVar8);
      builder.wasm = (Module *)((curr->offset).addr + 3);
      pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(Index *)(pEVar6 + 1) = local_4c;
      (pEVar6->type).id = local_68;
      pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
      pEVar7->_id = LocalGetId;
      *(Index *)(pEVar7 + 1) = index_00;
      (pEVar7->type).id = 2;
      pCVar9 = Builder::makeConst<int>(&local_48,0x18);
      pBVar10 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = ShrUInt32;
      pBVar10->left = pEVar7;
      pBVar10->right = (Expression *)pCVar9;
      Binary::finalize(pBVar10);
      local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
      local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
      pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
      *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&pSVar8->bytes = 0;
      (pSVar8->offset).addr = 0;
      (pSVar8->align).addr = 0;
      *(undefined8 *)&pSVar8->isAtomic = 0;
      (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      pSVar8->bytes = '\x01';
      (pSVar8->offset).addr = (address64_t)builder.wasm;
      (pSVar8->align).addr = 1;
      pSVar8->ptr = pEVar6;
      pSVar8->value = (Expression *)pBVar10;
      (pSVar8->valueType).id = 2;
      (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
      (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
      Store::finalize(pSVar8);
      goto LAB_007a0fbe;
    }
    local_58 = &(local_88->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    builder.wasm = (Module *)(curr->offset).addr;
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = index;
    (pEVar6->type).id = local_68;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = index_00;
    (pEVar7->type).id = 2;
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar8->bytes = '\x02';
    (pSVar8->offset).addr = (address64_t)builder.wasm;
    (pSVar8->align).addr = 2;
    pSVar8->ptr = pEVar6;
    pSVar8->value = pEVar7;
    (pSVar8->valueType).id = 2;
    (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar8);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_58,(Expression *)pSVar8);
    builder.wasm = (Module *)((curr->offset).addr + 2);
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = local_4c;
    (pEVar6->type).id = local_68;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = index_00;
    (pEVar7->type).id = 2;
    pCVar9 = Builder::makeConst<int>(&local_48,0x10);
    pBVar10 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
    (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar10->op = ShrUInt32;
    pBVar10->left = pEVar7;
    pBVar10->right = (Expression *)pCVar9;
    Binary::finalize(pBVar10);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar8->bytes = '\x02';
    (pSVar8->offset).addr = (address64_t)builder.wasm;
    (pSVar8->align).addr = 2;
    pSVar8->ptr = pEVar6;
    pSVar8->value = (Expression *)pBVar10;
  }
  else {
    if (curr->bytes != '\x02') {
      handle_unreachable("invalid size",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AlignmentLowering.cpp"
                         ,0xec);
    }
    local_58 = &(local_88->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    builder.wasm = (Module *)(curr->offset).addr;
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = index;
    (pEVar6->type).id = local_68;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = index_00;
    (pEVar7->type).id = 2;
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar8->bytes = '\x01';
    (pSVar8->offset).addr = (address64_t)builder.wasm;
    (pSVar8->align).addr = 1;
    pSVar8->ptr = pEVar6;
    pSVar8->value = pEVar7;
    (pSVar8->valueType).id = 2;
    (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
    (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
    Store::finalize(pSVar8);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (local_58,(Expression *)pSVar8);
    builder.wasm = (Module *)((curr->offset).addr + 1);
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = local_4c;
    (pEVar6->type).id = local_68;
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    *(Index *)(pEVar7 + 1) = index_00;
    (pEVar7->type).id = 2;
    pCVar9 = Builder::makeConst<int>(&local_48,8);
    pBVar10 = (Binary *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x28,8);
    (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar10->op = ShrUInt32;
    pBVar10->left = pEVar7;
    pBVar10->right = (Expression *)pCVar9;
    Binary::finalize(pBVar10);
    local_78._M_array = (iterator)(local_60->super_IString).str._M_len;
    local_78._M_len = (size_type)(local_60->super_IString).str._M_str;
    pSVar8 = (Store *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x58,8);
    *(undefined8 *)&(pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    *(undefined8 *)&pSVar8->bytes = 0;
    (pSVar8->offset).addr = 0;
    (pSVar8->align).addr = 0;
    *(undefined8 *)&pSVar8->isAtomic = 0;
    (pSVar8->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    pSVar8->bytes = '\x01';
    (pSVar8->offset).addr = (address64_t)builder.wasm;
    (pSVar8->align).addr = 1;
    pSVar8->ptr = pEVar6;
    pSVar8->value = (Expression *)pBVar10;
  }
  (pSVar8->valueType).id = 2;
  (pSVar8->memory).super_IString.str._M_len = (size_t)local_78._M_array;
  (pSVar8->memory).super_IString.str._M_str = (char *)local_78._M_len;
  Store::finalize(pSVar8);
LAB_007a0fbe:
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (local_58,(Expression *)pSVar8);
  pBVar4 = local_88;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pSVar8;
  Block::finalize(local_88,type_,Unknown);
  return (Expression *)pBVar4;
}

Assistant:

Expression* lowerStoreI32(Store* curr) {
    if (curr->align == 0 || curr->align == curr->bytes) {
      return curr;
    }
    Builder builder(*getModule());
    assert(curr->value->type == Type::i32);
    auto mem = getModule()->getMemory(curr->memory);
    auto addressType = mem->addressType;
    auto tempPtr = builder.addVar(getFunction(), addressType);
    auto tempValue = builder.addVar(getFunction(), Type::i32);
    auto* block =
      builder.makeBlock({builder.makeLocalSet(tempPtr, curr->ptr),
                         builder.makeLocalSet(tempValue, curr->value)});
    if (curr->bytes == 2) {
      block->list.push_back(
        builder.makeStore(1,
                          curr->offset,
                          1,
                          builder.makeLocalGet(tempPtr, addressType),
                          builder.makeLocalGet(tempValue, Type::i32),
                          Type::i32,
                          curr->memory));
      block->list.push_back(builder.makeStore(
        1,
        curr->offset + 1,
        1,
        builder.makeLocalGet(tempPtr, addressType),
        builder.makeBinary(ShrUInt32,
                           builder.makeLocalGet(tempValue, Type::i32),
                           builder.makeConst(int32_t(8))),
        Type::i32,
        curr->memory));
    } else if (curr->bytes == 4) {
      if (curr->align == 1) {
        block->list.push_back(
          builder.makeStore(1,
                            curr->offset,
                            1,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 1,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(8))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 2,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
        block->list.push_back(builder.makeStore(
          1,
          curr->offset + 3,
          1,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(24))),
          Type::i32,
          curr->memory));
      } else if (curr->align == 2) {
        block->list.push_back(
          builder.makeStore(2,
                            curr->offset,
                            2,
                            builder.makeLocalGet(tempPtr, addressType),
                            builder.makeLocalGet(tempValue, Type::i32),
                            Type::i32,
                            curr->memory));
        block->list.push_back(builder.makeStore(
          2,
          curr->offset + 2,
          2,
          builder.makeLocalGet(tempPtr, addressType),
          builder.makeBinary(ShrUInt32,
                             builder.makeLocalGet(tempValue, Type::i32),
                             builder.makeConst(int32_t(16))),
          Type::i32,
          curr->memory));
      } else {
        WASM_UNREACHABLE("invalid alignment");
      }
    } else {
      WASM_UNREACHABLE("invalid size");
    }
    block->finalize();
    return block;
  }